

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

int ON_CompareKnotVector
              (int orderA,int cv_countA,double *knotA,int orderB,int cv_countB,double *knotB)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  double dVar8;
  double dVar9;
  
  if (orderA < orderB) {
    return -1;
  }
  if (orderB < orderA) {
    return 1;
  }
  if (cv_countA < cv_countB) {
LAB_004c214c:
    iVar2 = -1;
  }
  else {
    if (cv_countA <= cv_countB) {
      if ((orderA < 2) || (knotA == (double *)0x0 || cv_countA < orderA)) {
        bVar1 = false;
      }
      else {
        in_XMM0_Qa = knotA[(ulong)(uint)orderA - 2];
        in_XMM1_Qa = knotA[(long)cv_countA + -1];
        bVar1 = true;
      }
      if (!bVar1) goto LAB_004c214c;
      if ((in_XMM0_Qa != in_XMM1_Qa) || (dVar8 = 0.0, NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
        dVar9 = (ABS(in_XMM0_Qa - in_XMM1_Qa) + ABS(in_XMM1_Qa) + ABS(in_XMM0_Qa)) *
                1.490116119385e-08;
        dVar8 = 2.220446049250313e-16;
        if (2.220446049250313e-16 <= dVar9) {
          dVar8 = dVar9;
        }
      }
      if ((orderA < 2) || (knotA == (double *)0x0 || cv_countA < orderA)) {
        bVar1 = false;
      }
      else {
        in_XMM0_Qa = knotA[(ulong)(uint)orderA - 2];
        in_XMM1_Qa = knotA[(long)cv_countA + -1];
        bVar1 = true;
      }
      if (bVar1) {
        uVar3 = (cv_countA + orderA) - 2;
        if ((in_XMM0_Qa != in_XMM1_Qa) || (dVar9 = 0.0, NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
          dVar5 = (ABS(in_XMM0_Qa - in_XMM1_Qa) + ABS(in_XMM1_Qa) + ABS(in_XMM0_Qa)) *
                  1.490116119385e-08;
          dVar9 = 2.220446049250313e-16;
          if (2.220446049250313e-16 <= dVar5) {
            dVar9 = dVar5;
          }
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        dVar8 = (double)(~-(ulong)(dVar8 <= dVar9) & (ulong)dVar9 |
                        (ulong)dVar8 & -(ulong)(dVar8 <= dVar9));
        uVar4 = 0;
        do {
          dVar9 = knotA[uVar4];
          dVar5 = knotB[uVar4];
          if ((dVar9 != dVar5) || (NAN(dVar9) || NAN(dVar5))) {
            if (dVar9 < dVar5 - dVar8) goto LAB_004c214c;
            if (dVar5 < dVar9 - dVar8) break;
            dVar6 = ON_KnotTolerance(orderA,cv_countA,knotA,(int)uVar4);
            dVar7 = ON_KnotTolerance(orderB,cv_countB,knotB,(int)uVar4);
            dVar6 = (double)(~-(ulong)(dVar6 <= dVar7) & (ulong)dVar7 |
                            (ulong)dVar6 & -(ulong)(dVar6 <= dVar7));
            if (dVar9 < dVar5 - dVar6) goto LAB_004c214c;
            if (dVar5 < dVar9 - dVar6) break;
          }
          uVar4 = uVar4 + 1;
          if (uVar3 == uVar4) {
            return 0;
          }
        } while( true );
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int ON_CompareKnotVector( // returns 
                                      // -1: first < second
                                      //  0: first == second
                                      // +1: first > second
          int orderA,
          int cv_countA,
          const double* knotA,
          int orderB,
          int cv_countB,
          const double* knotB
          )
{
  const int knot_count = ON_KnotCount(orderA,cv_countA);
  int i;
  double a, b, atol, btol, ktol, tol;
  if ( orderA < orderB )
    return -1;
  if ( orderA > orderB )
    return 1;
  if ( cv_countA < cv_countB )
    return -1;
  if ( cv_countA > cv_countB )
    return 1;

  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return -1;
  atol = ON_DomainTolerance( a, b );
  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return 1;
  btol = ON_DomainTolerance( a, b );
  tol = (atol <= btol) ? atol : btol;

  for ( i = 0; i < knot_count; i++ ) {
    a = knotA[i];
    b = knotB[i];
    if ( a == b )
      continue;
    if ( a < b-tol )
      return -1;
    if ( b < a-tol )
      return 1;
    atol = ON_KnotTolerance( orderA, cv_countA, knotA, i );
    btol = ON_KnotTolerance( orderB, cv_countB, knotB, i );
    ktol = (atol <= btol) ? atol : btol;
    if ( a < b-ktol )
      return -1;
    if ( b < a-ktol )
      return 1;
  }
  return 0;
}